

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double f_pdf(double x,int m,int n)

{
  double dVar1;
  double __x;
  __type _Var2;
  __type _Var3;
  __type _Var4;
  double dVar5;
  double dVar6;
  double top;
  double pdf;
  double bot2;
  double bot1;
  double b;
  double a;
  int n_local;
  int m_local;
  double x_local;
  
  if (0.0 <= x) {
    dVar1 = (double)m;
    __x = (double)n;
    _Var2 = std::pow<double,int>(dVar1,m);
    _Var3 = std::pow<double,int>(__x,n);
    _Var4 = std::pow<double,int>(x,m + -2);
    dVar5 = sqrt(_Var2 * _Var3 * _Var4);
    dVar6 = r8_beta(dVar1 / 2.0,__x / 2.0);
    _Var2 = std::pow<double,int>(dVar1 * x + __x,m + n);
    dVar1 = sqrt(_Var2);
    top = dVar5 / (dVar6 * dVar1);
  }
  else {
    top = 0.0;
  }
  return top;
}

Assistant:

double f_pdf ( double x, int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    F_PDF evaluates the F central PDF.
//
//  Discussion:
//
//    PDF(M,N;X) = M^(M/2) * X^((M-2)/2)
//      / ( Beta(M/2,N/2) * N^(M/2) * ( 1 + (M/N) * X )^((M+N)/2)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    0.0 <= X
//
//    Input, int M, N, the parameters of the PDF.
//    1 <= M,
//    1 <= N.
//
//    Output, double F_PDF, the value of the PDF.
//
{
  double a;
  double b;
  double bot1;
  double bot2;
  double pdf;
  double top;

  if ( x < 0.0 )
  {
    pdf = 0.0;
  }
  else
  {
    a = static_cast<double>(m );
    b = static_cast<double>(n );

    top = sqrt ( pow ( a, m ) * pow ( b, n ) * pow ( x, m - 2 ) );
    bot1 = r8_beta ( a / 2.0, b / 2.0 ) ;
    bot2 = sqrt ( pow ( b + a * x, m + n ) );

    pdf = top / ( bot1 * bot2 );
  }

  return pdf;
}